

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_scopes.cpp
# Opt level: O2

spv_result_t
spvtools::val::ValidateExecutionScope(ValidationState_t *_,Instruction *inst,uint32_t scope)

{
  ushort uVar1;
  bool bVar2;
  spv_result_t sVar3;
  char *pcVar4;
  Op opcode;
  string local_270;
  Function *local_250;
  _Any_data local_248;
  code *local_238;
  code *local_230;
  _Any_data local_228;
  code *local_218;
  code *local_210;
  string errorVUID;
  spv_result_t local_38;
  
  uVar1 = (inst->inst_).opcode;
  opcode = (Op)uVar1;
  ValidationState_t::EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)&errorVUID,_,scope);
  sVar3 = ValidateScope(_,inst,scope);
  if (sVar3 != SPV_SUCCESS) {
    return sVar3;
  }
  if (errorVUID._M_dataplus._M_p._4_1_ == '\0') {
    return SPV_SUCCESS;
  }
  bVar2 = spvIsVulkanEnv(_->context_->target_env);
  if (bVar2) {
    if (_->context_->target_env != SPV_ENV_VULKAN_1_0) {
      bVar2 = spvOpcodeIsNonUniformGroupOperation((uint)uVar1);
      if (((int)errorVUID._M_dataplus._M_p == 3 || !bVar2) || 0xfffffffd < uVar1 - 0x13f8)
      goto LAB_00186699;
      ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,inst);
      ValidationState_t::VkErrorID_abi_cxx11_(&local_270,_,0x1222,(char *)0x0);
      std::operator<<((ostream *)&errorVUID,(string *)&local_270);
      pcVar4 = spvOpcodeString((uint)uVar1);
      std::operator<<((ostream *)&errorVUID,pcVar4);
      std::operator<<((ostream *)&errorVUID,": in Vulkan environment Execution scope is limited to "
                     );
      pcVar4 = "Subgroup";
LAB_0018687f:
      std::operator<<((ostream *)&errorVUID,pcVar4);
      std::__cxx11::string::_M_dispose();
      goto LAB_0018697d;
    }
LAB_00186699:
    if ((int)errorVUID._M_dataplus._M_p != 3 && opcode == OpControlBarrier) {
      ValidationState_t::VkErrorID_abi_cxx11_(&errorVUID,_,0x124a,(char *)0x0);
      local_250 = ValidationState_t::function(_,inst->function_->id_);
      std::__cxx11::string::string((string *)&local_270,(string *)&errorVUID);
      local_228._8_8_ = 0;
      local_228._M_unused._M_object = operator_new(0x20);
      *(code **)local_228._M_unused._0_8_ = (code *)((long)local_228._M_unused._0_8_ + 0x10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p == &local_270.field_2) {
        *(long *)((long)local_228._M_unused._0_8_ + 0x10) =
             CONCAT71(local_270.field_2._M_allocated_capacity._1_7_,
                      local_270.field_2._M_local_buf[0]);
        *(undefined8 *)((long)local_228._M_unused._0_8_ + 0x18) = local_270.field_2._8_8_;
      }
      else {
        *(pointer *)local_228._M_unused._0_8_ = local_270._M_dataplus._M_p;
        *(long *)((long)local_228._M_unused._0_8_ + 0x10) =
             CONCAT71(local_270.field_2._M_allocated_capacity._1_7_,
                      local_270.field_2._M_local_buf[0]);
      }
      *(size_type *)((long)local_228._M_unused._0_8_ + 8) = local_270._M_string_length;
      local_270._M_string_length = 0;
      local_270.field_2._M_local_buf[0] = '\0';
      local_210 = std::
                  _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_scopes.cpp:116:46)>
                  ::_M_invoke;
      local_218 = std::
                  _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_scopes.cpp:116:46)>
                  ::_M_manager;
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      std::__cxx11::
      list<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
      ::push_back(&local_250->execution_model_limitations_,(value_type *)&local_228);
      if (local_218 != (code *)0x0) {
        (*local_218)(&local_228,&local_228,__destroy_functor);
      }
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
    }
    if ((int)errorVUID._M_dataplus._M_p == 2) {
      ValidationState_t::VkErrorID_abi_cxx11_(&errorVUID,_,0x121d,(char *)0x0);
      local_250 = ValidationState_t::function(_,inst->function_->id_);
      std::__cxx11::string::string((string *)&local_270,(string *)&errorVUID);
      local_248._8_8_ = 0;
      local_248._M_unused._M_object = operator_new(0x20);
      *(code **)local_248._M_unused._0_8_ = (code *)((long)local_248._M_unused._0_8_ + 0x10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p == &local_270.field_2) {
        *(long *)((long)local_248._M_unused._0_8_ + 0x10) =
             CONCAT71(local_270.field_2._M_allocated_capacity._1_7_,
                      local_270.field_2._M_local_buf[0]);
        *(undefined8 *)((long)local_248._M_unused._0_8_ + 0x18) = local_270.field_2._8_8_;
      }
      else {
        *(pointer *)local_248._M_unused._0_8_ = local_270._M_dataplus._M_p;
        *(long *)((long)local_248._M_unused._0_8_ + 0x10) =
             CONCAT71(local_270.field_2._M_allocated_capacity._1_7_,
                      local_270.field_2._M_local_buf[0]);
      }
      *(size_type *)((long)local_248._M_unused._0_8_ + 8) = local_270._M_string_length;
      local_270._M_string_length = 0;
      local_270.field_2._M_local_buf[0] = '\0';
      local_230 = std::
                  _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_scopes.cpp:147:15)>
                  ::_M_invoke;
      local_238 = std::
                  _Function_handler<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_scopes.cpp:147:15)>
                  ::_M_manager;
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      std::__cxx11::
      list<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(spv::ExecutionModel,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
      ::push_back(&local_250->execution_model_limitations_,(value_type *)&local_248);
      if (local_238 != (code *)0x0) {
        (*local_238)(&local_248,&local_248,__destroy_functor);
      }
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
    }
    else if ((int)errorVUID._M_dataplus._M_p - 4U < 0xfffffffe) {
      ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,inst);
      ValidationState_t::VkErrorID_abi_cxx11_(&local_270,_,0x121c,(char *)0x0);
      std::operator<<((ostream *)&errorVUID,(string *)&local_270);
      pcVar4 = spvOpcodeString(opcode);
      std::operator<<((ostream *)&errorVUID,pcVar4);
      std::operator<<((ostream *)&errorVUID,": in Vulkan environment Execution Scope is limited to "
                     );
      pcVar4 = "Workgroup and Subgroup";
      goto LAB_0018687f;
    }
  }
  bVar2 = spvOpcodeIsNonUniformGroupOperation(opcode);
  if (0xfffffffd < (int)errorVUID._M_dataplus._M_p - 4U ||
      (0xfffffffd < opcode + ~OpGroupNonUniformQuadAnyKHR || !bVar2)) {
    return SPV_SUCCESS;
  }
  ValidationState_t::diag((DiagnosticStream *)&errorVUID,_,SPV_ERROR_INVALID_DATA,inst);
  pcVar4 = spvOpcodeString(opcode);
  std::operator<<((ostream *)&errorVUID,pcVar4);
  std::operator<<((ostream *)&errorVUID,": Execution scope is limited to Subgroup or Workgroup");
LAB_0018697d:
  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&errorVUID);
  return local_38;
}

Assistant:

spv_result_t ValidateExecutionScope(ValidationState_t& _,
                                    const Instruction* inst, uint32_t scope) {
  spv::Op opcode = inst->opcode();
  bool is_int32 = false, is_const_int32 = false;
  uint32_t tmp_value = 0;
  std::tie(is_int32, is_const_int32, tmp_value) = _.EvalInt32IfConst(scope);

  if (auto error = ValidateScope(_, inst, scope)) {
    return error;
  }

  if (!is_const_int32) {
    return SPV_SUCCESS;
  }

  spv::Scope value = spv::Scope(tmp_value);

  // Vulkan specific rules
  if (spvIsVulkanEnv(_.context()->target_env)) {
    // Vulkan 1.1 specific rules
    if (_.context()->target_env != SPV_ENV_VULKAN_1_0) {
      // Scope for Non Uniform Group Operations must be limited to Subgroup
      if ((spvOpcodeIsNonUniformGroupOperation(opcode) &&
           (opcode != spv::Op::OpGroupNonUniformQuadAllKHR) &&
           (opcode != spv::Op::OpGroupNonUniformQuadAnyKHR)) &&
          (value != spv::Scope::Subgroup)) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << _.VkErrorID(4642) << spvOpcodeString(opcode)
               << ": in Vulkan environment Execution scope is limited to "
               << "Subgroup";
      }
    }

    // OpControlBarrier must only use Subgroup execution scope for a subset of
    // execution models.
    if (opcode == spv::Op::OpControlBarrier && value != spv::Scope::Subgroup) {
      std::string errorVUID = _.VkErrorID(4682);
      _.function(inst->function()->id())
          ->RegisterExecutionModelLimitation([errorVUID](
                                                 spv::ExecutionModel model,
                                                 std::string* message) {
            if (model == spv::ExecutionModel::Fragment ||
                model == spv::ExecutionModel::Vertex ||
                model == spv::ExecutionModel::Geometry ||
                model == spv::ExecutionModel::TessellationEvaluation ||
                model == spv::ExecutionModel::RayGenerationKHR ||
                model == spv::ExecutionModel::IntersectionKHR ||
                model == spv::ExecutionModel::AnyHitKHR ||
                model == spv::ExecutionModel::ClosestHitKHR ||
                model == spv::ExecutionModel::MissKHR) {
              if (message) {
                *message =
                    errorVUID +
                    "in Vulkan environment, OpControlBarrier execution scope "
                    "must be Subgroup for Fragment, Vertex, Geometry, "
                    "TessellationEvaluation, RayGeneration, Intersection, "
                    "AnyHit, ClosestHit, and Miss execution models";
              }
              return false;
            }
            return true;
          });
    }

    // Only subset of execution models support Workgroup.
    if (value == spv::Scope::Workgroup) {
      std::string errorVUID = _.VkErrorID(4637);
      _.function(inst->function()->id())
          ->RegisterExecutionModelLimitation(
              [errorVUID](spv::ExecutionModel model, std::string* message) {
                if (model != spv::ExecutionModel::TaskNV &&
                    model != spv::ExecutionModel::MeshNV &&
                    model != spv::ExecutionModel::TaskEXT &&
                    model != spv::ExecutionModel::MeshEXT &&
                    model != spv::ExecutionModel::TessellationControl &&
                    model != spv::ExecutionModel::GLCompute) {
                  if (message) {
                    *message =
                        errorVUID +
                        "in Vulkan environment, Workgroup execution scope is "
                        "only for TaskNV, MeshNV, TaskEXT, MeshEXT, "
                        "TessellationControl, and GLCompute execution models";
                  }
                  return false;
                }
                return true;
              });
    }

    // Vulkan generic rules
    // Scope for execution must be limited to Workgroup or Subgroup
    if (value != spv::Scope::Workgroup && value != spv::Scope::Subgroup) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << _.VkErrorID(4636) << spvOpcodeString(opcode)
             << ": in Vulkan environment Execution Scope is limited to "
             << "Workgroup and Subgroup";
    }
  }

  // TODO(atgoo@github.com) Add checks for OpenCL and OpenGL environments.

  // General SPIRV rules
  // Scope for execution must be limited to Workgroup or Subgroup for
  // non-uniform operations
  if (spvOpcodeIsNonUniformGroupOperation(opcode) &&
      opcode != spv::Op::OpGroupNonUniformQuadAllKHR &&
      opcode != spv::Op::OpGroupNonUniformQuadAnyKHR &&
      value != spv::Scope::Subgroup && value != spv::Scope::Workgroup) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << spvOpcodeString(opcode)
           << ": Execution scope is limited to Subgroup or Workgroup";
  }

  return SPV_SUCCESS;
}